

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O0

char * mpack_node_str(mpack_node_t node)

{
  mpack_error_t mVar1;
  mpack_type_t type;
  mpack_node_t node_local;
  
  mVar1 = mpack_node_error(node);
  if (mVar1 == mpack_ok) {
    if ((node.data)->type == mpack_type_str) {
      node_local.tree = (mpack_tree_t *)mpack_node_data_unchecked(node);
    }
    else {
      mpack_node_flag_error(node,mpack_error_type);
      node_local.tree = (mpack_tree_t *)0x0;
    }
  }
  else {
    node_local.tree = (mpack_tree_t *)0x0;
  }
  return (char *)node_local.tree;
}

Assistant:

MPACK_INLINE const char* mpack_node_str(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return NULL;

    mpack_type_t type = node.data->type;
    if (type == mpack_type_str)
        return mpack_node_data_unchecked(node);

    mpack_node_flag_error(node, mpack_error_type);
    return NULL;
}